

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O3

void __thiscall
websocketpp::connection<websocketpp::config::asio_client>::pong
          (connection<websocketpp::config::asio_client> *this,string *payload,error_code *ec)

{
  mutex_type *pmVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *pbVar2;
  element_type *peVar3;
  _Elt_pointer psVar4;
  _Elt_pointer psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  error_category *peVar9;
  size_t in_RCX;
  error_category *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  message_ptr msg;
  undefined1 local_218 [32];
  message_ptr local_1f8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  undefined1 local_1e0 [8];
  dispatch_handler local_1d8;
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  local_1b0;
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  pbVar2 = (this->m_alog).
           super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((pbVar2->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (pbVar2,0x400,"connection pong",in_RCX);
  }
  pmVar1 = &this->m_connection_state_lock;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  if (this->m_state != open) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,"connection::pong called from invalid state ",0x2b);
    std::ostream::operator<<((ostream *)local_1a0,this->m_state);
    pbVar2 = (this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (pbVar2,0x400,local_218,in_RCX);
    if ((element_type *)local_218._0_8_ != (element_type *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,
                      (ulong)((long)&(((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                        *)local_218._16_8_)->impl_).service_ + 1));
    }
    if (error::get_category()::instance == '\0') {
      pong();
    }
    ec->_M_value = 9;
    ec->_M_cat = (error_category *)&error::get_category()::instance;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
    std::ios_base::~ios_base(local_130);
    pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    return;
  }
  pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
  message_buffer::alloc::
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  ::get_message(&local_1b0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_1b0.
      super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
      ._M_weak_this.
      super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (error::get_category()::instance == '\0') {
      pong();
    }
    ec->_M_value = 7;
    peVar9 = (error_category *)&error::get_category()::instance;
  }
  else {
    peVar3 = (this->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio_client>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_1e8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1e0 = (undefined1  [8])
                local_1b0.
                super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
                ._M_weak_this.
                super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
    if ((element_type *)
        local_1b0.
        super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
        ._M_weak_this.
        super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1b0.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1b0.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    iVar8 = (*peVar3->_vptr_processor[0x15])(peVar3,payload,&local_1e8);
    ec->_M_value = iVar8;
    ec->_M_cat = extraout_RDX;
    if (local_1e0 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0);
      iVar8 = ec->_M_value;
    }
    if (iVar8 != 0) goto LAB_00142ca8;
    pmVar1 = &this->m_write_lock;
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
    if (iVar8 != 0) {
      std::__throw_system_error(iVar8);
    }
    local_1f8.
    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              local_1b0.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_1f8.
    super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if ((element_type *)
        local_1b0.
        super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
        ._M_weak_this.
        super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1b0.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b0.
         super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
         ._M_weak_this.
         super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_1b0.
              super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
              ._M_weak_this.
              super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    write_push(this,&local_1f8);
    if ((element_type *)
        local_1f8.
        super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.
                 super___shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (this->m_write_flag == false) {
      psVar4 = (this->m_send_queue).c.
               super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      psVar5 = (this->m_send_queue).c.
               super__Deque_base<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_std::allocator<std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
      if (psVar4 != psVar5) {
        get_shared((connection<websocketpp::config::asio_client> *)local_218);
        uVar7 = local_218._8_8_;
        uVar6 = local_218._0_8_;
        local_218._0_8_ = (element_type *)0x0;
        local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1d8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        local_1d8.super__Function_base._M_functor._8_8_ = (_Manager_type)0x0;
        local_1d8.super__Function_base._M_manager = (_Manager_type)0x0;
        local_1d8._M_invoker = (_Invoker_type)0x0;
        local_1d8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
        *(code **)local_1d8.super__Function_base._M_functor._M_unused._0_8_ = write_frame;
        *(undefined8 *)((long)local_1d8.super__Function_base._M_functor._M_unused._0_8_ + 8) = 0;
        *(undefined8 *)((long)local_1d8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
             uVar6;
        *(undefined8 *)((long)local_1d8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
             uVar7;
        local_1d8._M_invoker =
             std::
             _Function_handler<void_(),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>_>
             ::_M_invoke;
        local_1d8.super__Function_base._M_manager =
             std::
             _Function_handler<void_(),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio_client>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio_client>_>))()>_>
             ::_M_manager;
        transport::asio::connection<websocketpp::config::asio_client::transport_config>::dispatch
                  (&this->super_transport_con_type,&local_1d8);
        if (local_1d8.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_1d8.super__Function_base._M_manager)
                    ((_Any_data *)&local_1d8,(_Any_data *)&local_1d8,__destroy_functor);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
        }
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
    }
    peVar9 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
  }
  ec->_M_cat = peVar9;
LAB_00142ca8:
  if ((element_type *)
      local_1b0.
      super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
      ._M_weak_this.
      super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.
               super_enable_shared_from_this<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>_>
               ._M_weak_this.
               super___weak_ptr<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void connection<config>::pong(std::string const& payload, lib::error_code& ec) {
    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"connection pong");
    }

    {
        scoped_lock_type lock(m_connection_state_lock);
        if (m_state != session::state::open) {
            std::stringstream ss;
            ss << "connection::pong called from invalid state " << m_state;
            m_alog->write(log::alevel::devel,ss.str());
            ec = error::make_error_code(error::invalid_state);
            return;
        }
    }

    message_ptr msg = m_msg_manager->get_message();
    if (!msg) {
        ec = error::make_error_code(error::no_outgoing_buffers);
        return;
    }

    ec = m_processor->prepare_pong(payload,msg);
    if (ec) {return;}

    bool needs_writing = false;
    {
        scoped_lock_type lock(m_write_lock);
        write_push(msg);
        needs_writing = !m_write_flag && !m_send_queue.empty();
    }

    if (needs_writing) {
        transport_con_type::dispatch(lib::bind(
            &type::write_frame,
            type::get_shared()
        ));
    }

    ec = lib::error_code();
}